

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O0

void write_apu(Emulator *e,MaskedAddress addr,u8 value)

{
  SweepDirection SVar1;
  size_t sVar2;
  byte bVar3;
  Bool BVar4;
  Bool BVar5;
  ApuWrite *pAVar6;
  int local_44;
  int i;
  Bool is_enabled;
  Bool was_enabled;
  Bool trigger_3;
  u8 byte;
  u8 position;
  Bool trigger_2;
  Bool trigger_1;
  Bool trigger;
  SweepDirection old_direction;
  ApuWrite *write;
  u8 value_local;
  MaskedAddress addr_local;
  Emulator *e_local;
  
  if ((((e->config).log_apu_writes != FALSE) || ((e->state).apu.initialized == FALSE)) &&
     ((e->apu_log).write_count < 0x400)) {
    sVar2 = (e->apu_log).write_count;
    (e->apu_log).write_count = sVar2 + 1;
    pAVar6 = (e->apu_log).writes + sVar2;
    pAVar6->addr = (u8)addr;
    pAVar6->value = value;
  }
  if (((e->state).apu.enabled != FALSE) ||
     ((((e->state).is_cgb == FALSE &&
       (((addr == 1 || (addr == 6)) || ((addr == 0xb || (addr == 0x10)))))) || (addr == 0x16)))) {
    if ((e->state).apu.initialized != FALSE) {
      apu_synchronize(e);
    }
    switch(addr) {
    case 0:
      SVar1 = (e->state).apu.sweep.direction;
      (e->state).apu.sweep.period = (byte)((int)(uint)value >> 4) & 7;
      (e->state).apu.sweep.direction = (int)(uint)value >> 3 & SWEEP_DIRECTION_SUBTRACTION;
      (e->state).apu.sweep.shift = value & 7;
      if (((SVar1 == SWEEP_DIRECTION_SUBTRACTION) &&
          ((e->state).apu.sweep.direction == SWEEP_DIRECTION_ADDITION)) &&
         ((e->state).apu.sweep.calculated_subtract != FALSE)) {
        (e->state).apu.channel[0].status = FALSE;
      }
      break;
    case 1:
      write_nrx1_reg(e,(e->state).apu.channel,addr,value);
      break;
    case 2:
      write_nrx2_reg(e,(e->state).apu.channel,addr,value);
      break;
    case 3:
      write_nrx3_reg(e,(e->state).apu.channel,value);
      write_square_wave_period(e,(e->state).apu.channel,&(e->state).apu.channel[0].square_wave);
      break;
    case 4:
      BVar4 = write_nrx4_reg(e,(e->state).apu.channel,addr,value,0x40);
      write_square_wave_period(e,(e->state).apu.channel,&(e->state).apu.channel[0].square_wave);
      if (BVar4 != FALSE) {
        trigger_nrx4_envelope(e,&(e->state).apu.channel[0].envelope,addr);
        trigger_nr14_reg(e,(e->state).apu.channel);
        (e->state).apu.channel[0].square_wave.ticks = (e->state).apu.channel[0].square_wave.period;
      }
      break;
    case 6:
      write_nrx1_reg(e,(e->state).apu.channel + 1,addr,value);
      break;
    case 7:
      write_nrx2_reg(e,(e->state).apu.channel + 1,addr,value);
      break;
    case 8:
      write_nrx3_reg(e,(e->state).apu.channel + 1,value);
      write_square_wave_period(e,(e->state).apu.channel + 1,&(e->state).apu.channel[1].square_wave);
      break;
    case 9:
      BVar4 = write_nrx4_reg(e,(e->state).apu.channel + 1,addr,value,0x40);
      write_square_wave_period(e,(e->state).apu.channel + 1,&(e->state).apu.channel[1].square_wave);
      if (BVar4 != FALSE) {
        trigger_nrx4_envelope(e,&(e->state).apu.channel[1].envelope,addr);
        (e->state).apu.channel[1].square_wave.ticks = (e->state).apu.channel[1].square_wave.period;
      }
      break;
    case 10:
      (e->state).apu.channel[2].dac_enabled = (int)(uint)value >> 7;
      if ((e->state).apu.channel[2].dac_enabled == FALSE) {
        (e->state).apu.channel[2].status = FALSE;
        (e->state).apu.wave.playing = FALSE;
      }
      break;
    case 0xb:
      (e->state).apu.channel[2].length = 0x100 - value;
      break;
    case 0xc:
      (e->state).apu.wave.volume = (int)(uint)value >> 5 & WAVE_VOLUME_25;
      if (WAVE_VOLUME_25 < (e->state).apu.wave.volume) {
        __assert_fail("WAVE.volume < WAVE_VOLUME_COUNT",
                      "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/emulator.c"
                      ,0xc44,"void write_apu(Emulator *, MaskedAddress, u8)");
      }
      (e->state).apu.wave.volume_shift = s_wave_volume_shift[(e->state).apu.wave.volume];
      break;
    case 0xd:
      write_nrx3_reg(e,(e->state).apu.channel + 2,value);
      write_wave_period(e,(e->state).apu.channel + 2);
      break;
    case 0xe:
      BVar4 = write_nrx4_reg(e,(e->state).apu.channel + 2,addr,value,0x100);
      write_wave_period(e,(e->state).apu.channel + 2);
      if (BVar4 != FALSE) {
        if ((((e->state).is_cgb == FALSE) && ((e->state).apu.wave.playing != FALSE)) &&
           ((e->state).apu.wave.ticks == 2)) {
          if (0x1f < (e->state).apu.wave.position) {
            __assert_fail("WAVE.position < 32",
                          "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/emulator.c"
                          ,0xc53,"void write_apu(Emulator *, MaskedAddress, u8)");
          }
          bVar3 = (e->state).apu.wave.position + 1 & 0x1f;
          if (bVar3 >> 3 == 0) {
            (e->state).apu.wave.ram[0] = (e->state).apu.wave.ram[bVar3 >> 1];
          }
          else if ((bVar3 >> 3) - 1 < 3) {
            *(undefined4 *)(e->state).apu.wave.ram =
                 *(undefined4 *)((e->state).apu.wave.ram + (int)((int)(uint)bVar3 >> 1 & 0xc));
          }
        }
        (e->state).apu.wave.position = '\0';
        (e->state).apu.wave.ticks = (e->state).apu.wave.period + 6;
        (e->state).apu.wave.playing = TRUE;
      }
      break;
    case 0x10:
      write_nrx1_reg(e,(e->state).apu.channel + 3,addr,value);
      break;
    case 0x11:
      write_nrx2_reg(e,(e->state).apu.channel + 3,addr,value);
      break;
    case 0x12:
      (e->state).apu.noise.clock_shift = (u8)((int)(uint)value >> 4);
      (e->state).apu.noise.lfsr_width = (int)(uint)value >> 3 & LFSR_WIDTH_7;
      (e->state).apu.noise.divisor = value & 7;
      write_noise_period(e);
      break;
    case 0x13:
      BVar4 = write_nrx4_reg(e,(e->state).apu.channel + 3,addr,value,0x40);
      if (BVar4 != FALSE) {
        write_noise_period(e);
        trigger_nrx4_envelope(e,&(e->state).apu.channel[3].envelope,addr);
        (e->state).apu.noise.lfsr = 0x7fff;
        (e->state).apu.noise.sample = '\x01';
        (e->state).apu.noise.ticks = (e->state).apu.noise.period;
      }
      break;
    case 0x14:
      (e->state).apu.so_output[4][1] = (int)(uint)value >> 7;
      (e->state).apu.so_volume[1] = (byte)((int)(uint)value >> 4) & 7;
      (e->state).apu.so_output[4][0] = (int)(uint)value >> 3 & TRUE;
      (e->state).apu.so_volume[0] = value & 7;
      break;
    case 0x15:
      (e->state).apu.so_output[3][1] = (int)(uint)value >> 7;
      (e->state).apu.so_output[2][1] = (int)(uint)value >> 6 & TRUE;
      (e->state).apu.so_output[1][1] = (int)(uint)value >> 5 & TRUE;
      (e->state).apu.so_output[0][1] = (int)(uint)value >> 4 & TRUE;
      (e->state).apu.so_output[3][0] = (int)(uint)value >> 3 & TRUE;
      (e->state).apu.so_output[2][0] = (int)(uint)value >> 2 & TRUE;
      (e->state).apu.so_output[1][0] = (int)(uint)value >> 1 & TRUE;
      (e->state).apu.so_output[0][0] = value & TRUE;
      break;
    case 0x16:
      BVar4 = (e->state).apu.enabled;
      BVar5 = (int)(uint)value >> 7;
      if ((BVar4 == FALSE) || (BVar5 != FALSE)) {
        if ((BVar4 == FALSE) && (BVar5 != FALSE)) {
          (e->state).apu.frame = '\a';
        }
      }
      else {
        for (local_44 = 0; local_44 < 0x17; local_44 = local_44 + 1) {
          if (local_44 != 0x16) {
            write_apu(e,(MaskedAddress)local_44,'\0');
          }
        }
      }
      (e->state).apu.enabled = BVar5;
    }
  }
  return;
}

Assistant:

static void write_apu(Emulator* e, MaskedAddress addr, u8 value) {
  if (e->config.log_apu_writes || !APU.initialized) {
    if (e->apu_log.write_count < MAX_APU_LOG_FRAME_WRITES) {
      ApuWrite* write = &e->apu_log.writes[e->apu_log.write_count++];
      write->addr = addr;
      write->value = value;
    }
  }

  if (!APU.enabled) {
    if (!IS_CGB && (addr == APU_NR11_ADDR || addr == APU_NR21_ADDR ||
                    addr == APU_NR31_ADDR || addr == APU_NR41_ADDR)) {
      /* DMG allows writes to the length counters when power is disabled. */
    } else if (addr == APU_NR52_ADDR) {
      /* Always can write to NR52; it's necessary to re-enable power to APU. */
    } else {
      /* Ignore all other writes. */
      HOOK(write_apu_disabled_asb, addr, get_apu_reg_string(addr), value);
      return;
    }
  }

  if (APU.initialized) {
    apu_synchronize(e);
  }

  HOOK(write_apu_asb, addr, get_apu_reg_string(addr), value);
  switch (addr) {
    case APU_NR10_ADDR: {
      SweepDirection old_direction = SWEEP.direction;
      SWEEP.period = UNPACK(value, NR10_SWEEP_PERIOD);
      SWEEP.direction = UNPACK(value, NR10_SWEEP_DIRECTION);
      SWEEP.shift = UNPACK(value, NR10_SWEEP_SHIFT);
      if (old_direction == SWEEP_DIRECTION_SUBTRACTION &&
          SWEEP.direction == SWEEP_DIRECTION_ADDITION &&
          SWEEP.calculated_subtract) {
        CHANNEL1.status = FALSE;
      }
      break;
    }
    case APU_NR11_ADDR:
      write_nrx1_reg(e, &CHANNEL1, addr, value);
      break;
    case APU_NR12_ADDR:
      write_nrx2_reg(e, &CHANNEL1, addr, value);
      break;
    case APU_NR13_ADDR:
      write_nrx3_reg(e, &CHANNEL1, value);
      write_square_wave_period(e, &CHANNEL1, &CHANNEL1.square_wave);
      break;
    case APU_NR14_ADDR: {
      Bool trigger = write_nrx4_reg(e, &CHANNEL1, addr, value, NRX1_MAX_LENGTH);
      write_square_wave_period(e, &CHANNEL1, &CHANNEL1.square_wave);
      if (trigger) {
        trigger_nrx4_envelope(e, &CHANNEL1.envelope, addr);
        trigger_nr14_reg(e, &CHANNEL1);
        CHANNEL1.square_wave.ticks = CHANNEL1.square_wave.period;
      }
      break;
    }
    case APU_NR21_ADDR:
      write_nrx1_reg(e, &CHANNEL2, addr, value);
      break;
    case APU_NR22_ADDR:
      write_nrx2_reg(e, &CHANNEL2, addr, value);
      break;
    case APU_NR23_ADDR:
      write_nrx3_reg(e, &CHANNEL2, value);
      write_square_wave_period(e, &CHANNEL2, &CHANNEL2.square_wave);
      break;
    case APU_NR24_ADDR: {
      Bool trigger = write_nrx4_reg(e, &CHANNEL2, addr, value, NRX1_MAX_LENGTH);
      write_square_wave_period(e, &CHANNEL2, &CHANNEL2.square_wave);
      if (trigger) {
        trigger_nrx4_envelope(e, &CHANNEL2.envelope, addr);
        CHANNEL2.square_wave.ticks = CHANNEL2.square_wave.period;
      }
      break;
    }
    case APU_NR30_ADDR:
      CHANNEL3.dac_enabled = UNPACK(value, NR30_DAC_ENABLED);
      if (!CHANNEL3.dac_enabled) {
        CHANNEL3.status = FALSE;
        WAVE.playing = FALSE;
      }
      break;
    case APU_NR31_ADDR:
      CHANNEL3.length = NR31_MAX_LENGTH - value;
      break;
    case APU_NR32_ADDR:
      WAVE.volume = UNPACK(value, NR32_SELECT_WAVE_VOLUME);
      assert(WAVE.volume < WAVE_VOLUME_COUNT);
      WAVE.volume_shift = s_wave_volume_shift[WAVE.volume];
      break;
    case APU_NR33_ADDR:
      write_nrx3_reg(e, &CHANNEL3, value);
      write_wave_period(e, &CHANNEL3);
      break;
    case APU_NR34_ADDR: {
      Bool trigger = write_nrx4_reg(e, &CHANNEL3, addr, value, NR31_MAX_LENGTH);
      write_wave_period(e, &CHANNEL3);
      if (trigger) {
        if (!IS_CGB && WAVE.playing) {
          /* Triggering the wave channel while it is already playing will
           * corrupt the wave RAM on DMG. */
          if (WAVE.ticks == WAVE_TRIGGER_CORRUPTION_OFFSET_TICKS) {
            assert(WAVE.position < 32);
            u8 position = (WAVE.position + 1) & 31;
            u8 byte = WAVE.ram[position >> 1];
            switch (position >> 3) {
              case 0:
                WAVE.ram[0] = byte;
                break;
              case 1:
              case 2:
              case 3:
                memcpy(&WAVE.ram[0], &WAVE.ram[(position >> 1) & 12], 4);
                break;
            }
            HOOK(corrupt_wave_ram_i, position);
          }
        }

        WAVE.position = 0;
        WAVE.ticks = WAVE.period + WAVE_TRIGGER_DELAY_TICKS;
        WAVE.playing = TRUE;
      }
      break;
    }
    case APU_NR41_ADDR:
      write_nrx1_reg(e, &CHANNEL4, addr, value);
      break;
    case APU_NR42_ADDR:
      write_nrx2_reg(e, &CHANNEL4, addr, value);
      break;
    case APU_NR43_ADDR: {
      NOISE.clock_shift = UNPACK(value, NR43_CLOCK_SHIFT);
      NOISE.lfsr_width = UNPACK(value, NR43_LFSR_WIDTH);
      NOISE.divisor = UNPACK(value, NR43_DIVISOR);
      write_noise_period(e);
      break;
    }
    case APU_NR44_ADDR: {
      Bool trigger = write_nrx4_reg(e, &CHANNEL4, addr, value, NRX1_MAX_LENGTH);
      if (trigger) {
        write_noise_period(e);
        trigger_nrx4_envelope(e, &CHANNEL4.envelope, addr);
        NOISE.lfsr = 0x7fff;
        NOISE.sample = 1;
        NOISE.ticks = NOISE.period;
      }
      break;
    }
    case APU_NR50_ADDR:
      APU.so_output[VIN][1] = UNPACK(value, NR50_VIN_SO2);
      APU.so_volume[1] = UNPACK(value, NR50_SO2_VOLUME);
      APU.so_output[VIN][0] = UNPACK(value, NR50_VIN_SO1);
      APU.so_volume[0] = UNPACK(value, NR50_SO1_VOLUME);
      break;
    case APU_NR51_ADDR:
      APU.so_output[SOUND4][1] = UNPACK(value, NR51_SOUND4_SO2);
      APU.so_output[SOUND3][1] = UNPACK(value, NR51_SOUND3_SO2);
      APU.so_output[SOUND2][1] = UNPACK(value, NR51_SOUND2_SO2);
      APU.so_output[SOUND1][1] = UNPACK(value, NR51_SOUND1_SO2);
      APU.so_output[SOUND4][0] = UNPACK(value, NR51_SOUND4_SO1);
      APU.so_output[SOUND3][0] = UNPACK(value, NR51_SOUND3_SO1);
      APU.so_output[SOUND2][0] = UNPACK(value, NR51_SOUND2_SO1);
      APU.so_output[SOUND1][0] = UNPACK(value, NR51_SOUND1_SO1);
      break;
    case APU_NR52_ADDR: {
      Bool was_enabled = APU.enabled;
      Bool is_enabled = UNPACK(value, NR52_ALL_SOUND_ENABLED);
      if (was_enabled && !is_enabled) {
        HOOK0(apu_power_down_v);
        int i;
        for (i = 0; i < APU_REG_COUNT; ++i) {
          if (i != APU_NR52_ADDR) {
            write_apu(e, i, 0);
          }
        }
      } else if (!was_enabled && is_enabled) {
        HOOK0(apu_power_up_v);
        APU.frame = 7;
      }
      APU.enabled = is_enabled;
      break;
    }
  }
}